

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O3

IndexTensor *
dynet::TensorTools::argmax_dev<dynet::Device_CPU>
          (IndexTensor *__return_storage_ptr__,Device_CPU *dev,Tensor *v,uint dim,uint num)

{
  DeviceMempool DVar1;
  Device *pDVar2;
  runtime_error *this;
  invalid_argument *this_00;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  array<Index,_1> in_dims;
  _Type alVar7;
  Dim ids_dim;
  ostringstream oss;
  type local_200;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  ulong uStack_1c0;
  uint local_1b8;
  TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<long,_4,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorTupleReducerOp<Eigen::internal::ArgMaxTupleReducer<Eigen::Tuple<long,_float>_>,_const_std::array<long,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>_>_>
  local_1b0;
  type local_1a0 [5];
  
  if (1 < num) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"Currently do not support num > 1 in argmax",0x2a);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(this,(string *)&local_200);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  DVar1 = v->mem_pool;
  if ((long)(int)DVar1 == 4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "Input Tensor to TensorTools::argmax must be associated with a memory pool.",0x4a);
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::invalid_argument::invalid_argument(this_00,(string *)&local_200);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_1b8 = (v->d).bd;
  local_1c8 = *(undefined8 *)((v->d).d + 4);
  uStack_1c0 = *(ulong *)((v->d).d + 6);
  local_1d8 = *(undefined8 *)(v->d).d;
  uStack_1d0 = *(undefined8 *)((v->d).d + 2);
  alVar7[0]._4_4_ = 0;
  alVar7[0]._0_4_ = dim;
  *(uint *)((long)&local_1d8 + alVar7[0] * 4) = num;
  pDVar2 = v->device;
  (__return_storage_ptr__->d).bd = local_1b8;
  *(undefined8 *)((__return_storage_ptr__->d).d + 4) = local_1c8;
  *(ulong *)((__return_storage_ptr__->d).d + 6) = uStack_1c0;
  *(undefined8 *)(__return_storage_ptr__->d).d = local_1d8;
  *(undefined8 *)((__return_storage_ptr__->d).d + 2) = uStack_1d0;
  __return_storage_ptr__->device = pDVar2;
  __return_storage_ptr__->mem_pool = DVar1;
  iVar6 = 1;
  if (uStack_1c0 >> 0x20 != 0) {
    uVar3 = 0;
    do {
      iVar6 = iVar6 * *(int *)((long)&local_1d8 + uVar3 * 4);
      uVar3 = uVar3 + 1;
    } while (uStack_1c0 >> 0x20 != uVar3);
  }
  local_200.m_data =
       (StoragePointerType)
       AlignedMemoryPool::allocate
                 ((pDVar2->pools).
                  super__Vector_base<dynet::AlignedMemoryPool_*,_std::allocator<dynet::AlignedMemoryPool_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[(int)DVar1],
                  (ulong)(iVar6 * local_1b8) << 3);
  __return_storage_ptr__->v = local_200.m_data;
  uVar5 = (v->d).nd;
  local_1a0[0].m_xpr.m_data = v->v;
  if (uVar5 == 2) {
    uVar4 = (v->d).d[0];
    local_1a0[0].m_xpr.m_dimensions.super_array<long,_5>._M_elems[1] = (long)(int)(v->d).d[1];
LAB_0041a96c:
    local_1a0[0].m_xpr.m_dimensions.super_array<long,_5>._M_elems[2] = 1;
LAB_0041a971:
    local_1a0[0].m_xpr.m_dimensions.super_array<long,_5>._M_elems[3] = 1;
  }
  else {
    if (uVar5 == 3) {
      uVar4 = (v->d).d[0];
      local_1a0[0].m_xpr.m_dimensions.super_array<long,_5>._M_elems[1] = (long)(int)(v->d).d[1];
      local_1a0[0].m_xpr.m_dimensions.super_array<long,_5>._M_elems[2] = (long)(int)(v->d).d[2];
      goto LAB_0041a971;
    }
    if (uVar5 != 4) {
      uVar4 = 1;
      if (uVar5 != 0) {
        uVar4 = (v->d).d[0];
      }
      local_1a0[0].m_xpr.m_dimensions.super_array<long,_5>._M_elems[1] = 1;
      goto LAB_0041a96c;
    }
    uVar4 = (v->d).d[0];
    local_1a0[0].m_xpr.m_dimensions.super_array<long,_5>._M_elems[1] = (long)(int)(v->d).d[1];
    local_1a0[0].m_xpr.m_dimensions.super_array<long,_5>._M_elems[2] = (long)(int)(v->d).d[2];
    local_1a0[0].m_xpr.m_dimensions.super_array<long,_5>._M_elems[3] = (long)(int)(v->d).d[3];
  }
  local_1a0[0].m_xpr.m_dimensions.super_array<long,_5>._M_elems[4] = (long)(int)(v->d).bd;
  local_1a0[0].m_xpr.m_dimensions.super_array<long,_5>._M_elems[0] = (long)(int)uVar4;
  uVar5 = (__return_storage_ptr__->d).nd;
  if (uVar5 == 2) {
    uVar4 = (__return_storage_ptr__->d).d[0];
    local_200.m_dimensions.super_array<long,_4>._M_elems[1] =
         (long)(int)(__return_storage_ptr__->d).d[1];
    uVar5 = (__return_storage_ptr__->d).bd;
  }
  else {
    if (uVar5 == 3) {
      uVar4 = (__return_storage_ptr__->d).d[0];
      local_200.m_dimensions.super_array<long,_4>._M_elems[1] =
           (long)(int)(__return_storage_ptr__->d).d[1];
      local_200.m_dimensions.super_array<long,_4>._M_elems[2] =
           (long)(int)(__return_storage_ptr__->d).d[2];
      uVar5 = (__return_storage_ptr__->d).bd;
      goto LAB_0041aa17;
    }
    uVar4 = 1;
    if (uVar5 != 0) {
      uVar4 = (__return_storage_ptr__->d).d[0];
    }
    uVar5 = (__return_storage_ptr__->d).bd;
    local_200.m_dimensions.super_array<long,_4>._M_elems[1] = 1;
  }
  local_200.m_dimensions.super_array<long,_4>._M_elems[2] = 1;
LAB_0041aa17:
  local_200.m_dimensions.super_array<long,_4>._M_elems[0] = (long)(int)uVar4;
  local_200.m_dimensions.super_array<long,_4>._M_elems[3] = (long)(int)uVar5;
  local_1b0.m_lhs_xpr = &local_200;
  local_1b0.m_rhs_xpr = local_1a0;
  local_1a0[0].m_return_dim = alVar7[0];
  local_1a0[0].m_reduce_dims._M_elems[0] = (_Type)(_Type)alVar7[0];
  Eigen::internal::
  TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<long,_4,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorTupleReducerOp<Eigen::internal::ArgMaxTupleReducer<Eigen::Tuple<long,_float>_>,_const_std::array<long,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::DefaultDevice,_false,_(Eigen::internal::TiledEvaluation)0>
  ::run(&local_1b0,dev->edevice);
  return __return_storage_ptr__;
}

Assistant:

IndexTensor TensorTools::argmax_dev(const MyDevice & dev, const Tensor& v, unsigned dim, unsigned num) {
  if(num > 1)
    DYNET_RUNTIME_ERR("Currently do not support num > 1 in argmax");
  DYNET_ARG_CHECK(v.mem_pool != DeviceMempool::NONE, "Input Tensor to TensorTools::argmax must be associated with a memory pool.");
  Dim ids_dim = v.d; ids_dim.d[dim] = num;
  IndexTensor ids(ids_dim, nullptr, v.device, v.mem_pool);
  AlignedMemoryPool* pool = v.device->pools[(size_t)v.mem_pool];
  ids.v = static_cast<Eigen::DenseIndex*>(pool->allocate(ids_dim.size() * sizeof(Eigen::DenseIndex)));
  ids.tb<3>().device(*dev.edevice) = v.tb<4>().argmax(dim);
  return ids;
}